

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamIteratorInterface<std::tuple<long_(*)(const_int_*,_const_int_*,_long,_long_*,_int),_long_(*)(const_int_*,_const_int_*,_long,_long_*,_int),_aom_bit_depth>_>
* __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<std::tuple<long_(*)(const_int_*,_const_int_*,_long,_long_*,_int),_long_(*)(const_int_*,_const_int_*,_long,_long_*,_int),_aom_bit_depth>_>
::Iterator::Clone(Iterator *this)

{
  Iterator *this_00;
  Iterator *in_RDI;
  
  this_00 = (Iterator *)operator_new(0x20);
  Iterator(this_00,in_RDI);
  return &this_00->
          super_ParamIteratorInterface<std::tuple<long_(*)(const_int_*,_const_int_*,_long,_long_*,_int),_long_(*)(const_int_*,_const_int_*,_long,_long_*,_int),_aom_bit_depth>_>
  ;
}

Assistant:

ParamIteratorInterface<T>* Clone() const override {
      return new Iterator(*this);
    }